

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_trace.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_2c;
  int c;
  int use_colors;
  char *chipset;
  char *event;
  char **argv_local;
  int argc_local;
  
  chipset = (char *)0x0;
  _c = (char *)0x0;
  local_2c = 1;
  if (argc < 4) {
    usage();
    argv_local._4_4_ = 1;
  }
  else {
    while (iVar1 = getopt(argc,argv,"a:c:e:"), iVar1 != -1) {
      if (iVar1 == 0x61) {
        _c = strdup(_optarg);
      }
      else if (iVar1 == 99) {
        local_2c = 0;
      }
      else if (iVar1 == 0x65) {
        chipset = strdup(_optarg);
      }
      else {
        usage();
      }
    }
    if ((_c == (char *)0x0) || (chipset == (char *)0x0)) {
      usage();
    }
    init_rnnctx(_c,local_2c);
    iVar1 = lookup_trace(_c,chipset);
    if (iVar1 == 0) {
      destroy_rnnctx();
      argv_local._4_4_ = 0;
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char **argv)
{
	char *event = NULL, *chipset = NULL;
	int use_colors = 1;
	int c;

	if (argc < 4) {
		usage();
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt(argc, argv, "a:c:e:")) != -1) {
		switch (c) {
			case 'a':
				chipset = strdup(optarg);
				break;
			case 'c':
				use_colors = 0;
				break;
			case 'e':
				event = strdup(optarg);
				break;
			default:
				usage();
		}
	}

	if (!chipset || !event)
		usage();

	init_rnnctx(chipset, use_colors);

	if (lookup_trace(chipset, event))
		return 1;

	destroy_rnnctx();

	return 0;
}